

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O0

JL_STATUS JlSetObjectNumberString(JlDataObject *NumberObject,char *NumberString)

{
  int iVar1;
  anon_union_8_2_61cdaf61 a_nan;
  double a_ninf_1;
  double a_inf_1;
  double a_ninf;
  double a_inf;
  double f64;
  int64_t s64;
  uint64_t u64;
  char newString [32];
  JL_STATUS local_1c;
  int converted;
  JL_STATUS jlStatus;
  char *NumberString_local;
  JlDataObject *NumberObject_local;
  
  memset(&u64,0,0x20);
  if ((NumberObject == (JlDataObject *)0x0) || (NumberString == (char *)0x0)) {
    local_1c = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    local_1c = JL_STATUS_INVALID_DATA;
    s64 = 0;
    if ((*NumberString == '0') && ((NumberString[1] == 'x' || (NumberString[1] == 'X')))) {
      iVar1 = __isoc99_sscanf(NumberString,"%lx",&s64);
      if (iVar1 == 1) {
        local_1c = JlSetObjectNumberHex(NumberObject,s64);
      }
    }
    else {
      iVar1 = __isoc99_sscanf(NumberString,"%lu",&s64);
      if (iVar1 == 1) {
        sprintf((char *)&u64,"%lu",s64);
        iVar1 = strcmp(NumberString,(char *)&u64);
        if (iVar1 == 0) {
          local_1c = JlSetObjectNumberU64(NumberObject,s64);
        }
      }
    }
    if (local_1c != JL_STATUS_SUCCESS) {
      f64 = 0.0;
      iVar1 = __isoc99_sscanf(NumberString,"%ld",&f64);
      if (iVar1 == 1) {
        sprintf((char *)&u64,"%ld",f64);
        iVar1 = strcmp(NumberString,(char *)&u64);
        if (iVar1 == 0) {
          local_1c = JlSetObjectNumberS64(NumberObject,(int64_t)f64);
        }
      }
    }
    if (local_1c != JL_STATUS_SUCCESS) {
      a_inf = 0.0;
      iVar1 = __isoc99_sscanf(NumberString,"%lg",&a_inf);
      if (((iVar1 == 1) &&
          ((((a_inf != 0.0 || (NAN(a_inf))) && (!NAN(a_inf))) &&
           ((a_inf != INFINITY || (NAN(a_inf))))))) && ((a_inf != -INFINITY || (NAN(a_inf))))) {
        local_1c = JlSetObjectNumberF64(NumberObject,a_inf);
      }
    }
    if (local_1c != JL_STATUS_SUCCESS) {
      iVar1 = strcasecmp(NumberString,"inf");
      if ((iVar1 == 0) || (iVar1 = strcasecmp(NumberString,"+inf"), iVar1 == 0)) {
        local_1c = JlSetObjectNumberF64(NumberObject,INFINITY);
      }
      else {
        iVar1 = strcasecmp(NumberString,"-inf");
        if (iVar1 == 0) {
          local_1c = JlSetObjectNumberF64(NumberObject,-INFINITY);
        }
        else {
          iVar1 = strcasecmp(NumberString,"nan");
          if (iVar1 == 0) {
            local_1c = JlSetObjectNumberF64(NumberObject,NAN);
          }
        }
      }
    }
  }
  return local_1c;
}

Assistant:

JL_STATUS
    JlSetObjectNumberString
    (
        JlDataObject*   NumberObject,
        char const*     NumberString
    )
{
    JL_STATUS jlStatus;
    int converted;
    char newString [32] = "";

    if(     NULL != NumberObject
        &&  NULL != NumberString )
    {
        jlStatus = JL_STATUS_INVALID_DATA;

        if( JL_STATUS_SUCCESS != jlStatus )
        {
            // Try to convert the number as u64 first
            uint64_t u64 = 0;
            if( '0' == NumberString[0] && ( 'x' == NumberString[1] || 'X' == NumberString[1] ) )
            {
                // Hex
                converted = sscanf( NumberString, "%"PRIx64"", &u64 );
                if( 1 == converted )
                {
                    // Note: We don't check the exact string match in hex mode because the source
                    // string may be padded eg: 0x0001
                    jlStatus = JlSetObjectNumberHex( NumberObject, u64 );
                }
            }
            else
            {
                // Decimal
                converted = sscanf( NumberString, "%"PRIu64"", &u64 );
                if( 1 == converted )
                {
                    sprintf( newString, "%"PRIu64"", u64 );
                    if( strcmp( NumberString, newString ) == 0 )
                    {
                        jlStatus = JlSetObjectNumberU64( NumberObject, u64 );
                    }
                }
            }
        }

        if( JL_STATUS_SUCCESS != jlStatus )
        {
            // Try to convert the number as a signed 64 bit number
            int64_t s64 = 0;
            converted = sscanf( NumberString, "%"PRId64"", &s64 );
            if( 1 == converted )
            {
                sprintf( newString, "%"PRId64"", s64 );
                if( strcmp( NumberString, newString ) == 0 )
                {
                    jlStatus = JlSetObjectNumberS64( NumberObject, s64 );
                }
            }

        }

        if( JL_STATUS_SUCCESS != jlStatus )
        {
            // Try to convert the number as a float
            double f64 = 0.0;
            converted = sscanf( NumberString, "%lg", &f64 );
            if( 1 == converted )
            {
                double a_inf = DBL_MAX * 2.0;
                double a_ninf = DBL_MAX * -2.0;

                if(     0.0 != f64
                    &&  !isnan( f64 )
                    &&  a_inf != f64
                    &&  a_ninf != f64 )
                {
                    jlStatus = JlSetObjectNumberF64( NumberObject, f64 );
                }
            }
        }

        if( JL_STATUS_SUCCESS != jlStatus )
        {
            // Try to convert as inf, +inf, -inf, or nan
            if( strcasecmp( NumberString, "inf" ) == 0 || strcasecmp( NumberString, "+inf" ) == 0 )
            {
                double a_inf = DBL_MAX * 2.0;
                jlStatus = JlSetObjectNumberF64( NumberObject, a_inf );
            }
            else if( strcasecmp( NumberString, "-inf" ) == 0 )
            {
                double a_ninf = DBL_MAX * -2.0;
                jlStatus = JlSetObjectNumberF64( NumberObject, a_ninf );
            }
            else if( strcasecmp( NumberString, "nan" ) == 0 )
            {
                union
                {
                    uint64_t    bits;
                    double      f64;
                } a_nan = { 0x7fffffffffffffffULL };      // Set all bits except sign to make a NaN

                jlStatus = JlSetObjectNumberF64( NumberObject, a_nan.f64 );
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}